

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getRcut(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  FuncflParameters local_88;
  
  getFuncflParam(&local_88,this);
  FuncflParameters::~FuncflParameters(&local_88);
  return local_88.rcut;
}

Assistant:

RealType EAMAdapter::getRcut() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.rcut;
  }